

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit.cpp
# Opt level: O0

void test_qpixl_frqi_compressedFRQICircuit<float>(void)

{
  allocator<float> *paVar1;
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  initializer_list<float> __l_01;
  float *pfVar2;
  vector<float,_std::allocator<float>_> *a_00;
  vector<float,_std::allocator<float>_> *a_01;
  vector<float,_std::allocator<float>_> *a_02;
  undefined1 local_1e0 [24];
  SquareMatrix<float> circC_check;
  QCircuit<float,_qclab::QObject<float>_> circC;
  float local_188 [10];
  iterator local_160;
  size_type local_158;
  undefined1 local_150 [8];
  vector<float,_std::allocator<float>_> c;
  undefined1 local_128 [8];
  SquareMatrix<float> circB_check;
  QCircuit<float,_qclab::QObject<float>_> circB;
  float local_e0 [4];
  iterator local_d0;
  size_type local_c8;
  undefined1 local_c0 [8];
  vector<float,_std::allocator<float>_> b;
  undefined1 local_98 [8];
  SquareMatrix<float> circA_check;
  QCircuit<float,_qclab::QObject<float>_> circA;
  allocator<float> local_41;
  float local_40 [2];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<float,_std::allocator<float>_> a;
  float eps;
  
  a.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = std::numeric_limits<float>::epsilon();
  local_40[0] = 0.5;
  local_40[1] = 1.0;
  local_38 = local_40;
  local_30 = 2;
  std::allocator<float>::allocator(&local_41);
  __l_01._M_len = local_30;
  __l_01._M_array = local_38;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_28,__l_01,&local_41);
  std::allocator<float>::~allocator(&local_41);
  qpixl::frqi::compressedFRQICircuit<std::vector<float,std::allocator<float>>>
            ((QCircuit<float,_qclab::QObject<float>_> *)&circA_check.data_,(frqi *)local_28,a_00,0.0
            );
  qclab::dense::SquareMatrix<float>::SquareMatrix
            ((SquareMatrix<float> *)local_98,0.62054455,-0.33900505,0.62054455,-0.33900505,
             0.33900505,0.62054455,0.33900505,0.62054455,0.38205144,-0.59500986,-0.38205144,
             0.59500986,0.59500986,0.38205144,-0.59500986,-0.38205144);
  qclab::QCircuit<float,_qclab::QObject<float>_>::matrix
            ((QCircuit<float,_qclab::QObject<float>_> *)
             &b.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  test_qpixl_frqi_check_matrix<qclab::dense::SquareMatrix<float>,qclab::dense::SquareMatrix<float>,float>
            ((SquareMatrix<float> *)
             &b.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,(SquareMatrix<float> *)local_98,1.1920929e-06);
  qclab::dense::SquareMatrix<float>::~SquareMatrix
            ((SquareMatrix<float> *)
             &b.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  local_e0[0] = 0.5;
  local_e0[1] = 1.0;
  local_e0[2] = 1.5;
  local_e0[3] = 2.0;
  local_d0 = local_e0;
  local_c8 = 4;
  paVar1 = (allocator<float> *)
           ((long)&circB.gates_.
                   super__Vector_base<std::unique_ptr<qclab::QObject<float>,_std::default_delete<qclab::QObject<float>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<float>,_std::default_delete<qclab::QObject<float>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<float>::allocator(paVar1);
  __l_00._M_len = local_c8;
  __l_00._M_array = local_d0;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_c0,__l_00,paVar1);
  std::allocator<float>::~allocator
            ((allocator<float> *)
             ((long)&circB.gates_.
                     super__Vector_base<std::unique_ptr<qclab::QObject<float>,_std::default_delete<qclab::QObject<float>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<float>,_std::default_delete<qclab::QObject<float>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  qpixl::frqi::compressedFRQICircuit<std::vector<float,std::allocator<float>>>
            ((QCircuit<float,_qclab::QObject<float>_> *)&circB_check.data_,(frqi *)local_c0,a_01,0.0
            );
  qclab::dense::SquareMatrix<float>::SquareMatrix((SquareMatrix<float> *)local_128,8);
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,0,0);
  *pfVar2 = 0.43879128;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,1,0);
  *pfVar2 = 0.23971277;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,2,0);
  *pfVar2 = 0.27015114;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,3,0);
  *pfVar2 = 0.42073548;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,4,0);
  *pfVar2 = 0.0353686;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,5,0);
  *pfVar2 = 0.4987475;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,6,0);
  *pfVar2 = -0.20807342;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,7,0);
  *pfVar2 = 0.4546487;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,0,1);
  *pfVar2 = -0.23971277;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,1,1);
  *pfVar2 = 0.43879128;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,2,1);
  *pfVar2 = -0.42073548;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,3,1);
  *pfVar2 = 0.27015114;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,4,1);
  *pfVar2 = -0.4987475;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,5,1);
  *pfVar2 = 0.0353686;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,6,1);
  *pfVar2 = -0.4546487;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,7,1);
  *pfVar2 = -0.20807342;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,0,2);
  *pfVar2 = 0.43879128;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,1,2);
  *pfVar2 = 0.23971277;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,2,2);
  *pfVar2 = -0.27015114;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,3,2);
  *pfVar2 = -0.42073548;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,4,2);
  *pfVar2 = 0.0353686;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,5,2);
  *pfVar2 = 0.4987475;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,6,2);
  *pfVar2 = 0.20807342;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,7,2);
  *pfVar2 = -0.4546487;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,0,3);
  *pfVar2 = -0.23971277;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,1,3);
  *pfVar2 = 0.43879128;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,2,3);
  *pfVar2 = 0.42073548;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,3,3);
  *pfVar2 = -0.27015114;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,4,3);
  *pfVar2 = -0.4987475;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,5,3);
  *pfVar2 = 0.0353686;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,6,3);
  *pfVar2 = 0.4546487;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,7,3);
  *pfVar2 = 0.20807342;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,0,4);
  *pfVar2 = 0.43879128;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,1,4);
  *pfVar2 = 0.23971277;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,2,4);
  *pfVar2 = 0.27015114;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,3,4);
  *pfVar2 = 0.42073548;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,4,4);
  *pfVar2 = -0.0353686;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,5,4);
  *pfVar2 = -0.4987475;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,6,4);
  *pfVar2 = 0.20807342;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,7,4);
  *pfVar2 = -0.4546487;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,0,5);
  *pfVar2 = -0.23971277;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,1,5);
  *pfVar2 = 0.43879128;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,2,5);
  *pfVar2 = -0.42073548;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,3,5);
  *pfVar2 = 0.27015114;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,4,5);
  *pfVar2 = 0.4987475;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,5,5);
  *pfVar2 = -0.0353686;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,6,5);
  *pfVar2 = 0.4546487;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,7,5);
  *pfVar2 = 0.20807342;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,0,6);
  *pfVar2 = 0.43879128;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,1,6);
  *pfVar2 = 0.23971277;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,2,6);
  *pfVar2 = -0.27015114;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,3,6);
  *pfVar2 = -0.42073548;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,4,6);
  *pfVar2 = -0.0353686;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,5,6);
  *pfVar2 = -0.4987475;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,6,6);
  *pfVar2 = -0.20807342;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,7,6);
  *pfVar2 = 0.4546487;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,0,7);
  *pfVar2 = -0.23971277;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,1,7);
  *pfVar2 = 0.43879128;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,2,7);
  *pfVar2 = 0.42073548;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,3,7);
  *pfVar2 = -0.27015114;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,4,7);
  *pfVar2 = 0.4987475;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,5,7);
  *pfVar2 = -0.0353686;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,6,7);
  *pfVar2 = -0.4546487;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_128,7,7);
  *pfVar2 = -0.20807342;
  qclab::QCircuit<float,_qclab::QObject<float>_>::matrix
            ((QCircuit<float,_qclab::QObject<float>_> *)
             &c.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  test_qpixl_frqi_check_matrix<qclab::dense::SquareMatrix<float>,qclab::dense::SquareMatrix<float>,float>
            ((SquareMatrix<float> *)
             &c.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,(SquareMatrix<float> *)local_128,1.1920929e-06);
  qclab::dense::SquareMatrix<float>::~SquareMatrix
            ((SquareMatrix<float> *)
             &c.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  local_188[4] = 2.5;
  local_188[5] = 3.0;
  local_188[6] = 3.5;
  local_188[7] = 4.0;
  local_188[0] = 0.5;
  local_188[1] = 1.0;
  local_188[2] = 1.5;
  local_188[3] = 2.0;
  local_160 = local_188;
  local_158 = 8;
  paVar1 = (allocator<float> *)
           ((long)&circC.gates_.
                   super__Vector_base<std::unique_ptr<qclab::QObject<float>,_std::default_delete<qclab::QObject<float>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<float>,_std::default_delete<qclab::QObject<float>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<float>::allocator(paVar1);
  __l._M_len = local_158;
  __l._M_array = local_160;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_150,__l,paVar1);
  std::allocator<float>::~allocator
            ((allocator<float> *)
             ((long)&circC.gates_.
                     super__Vector_base<std::unique_ptr<qclab::QObject<float>,_std::default_delete<qclab::QObject<float>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<float>,_std::default_delete<qclab::QObject<float>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  qpixl::frqi::compressedFRQICircuit<std::vector<float,std::allocator<float>>>
            ((QCircuit<float,_qclab::QObject<float>_> *)&circC_check.data_,(frqi *)local_150,a_02,
             0.0);
  qclab::dense::SquareMatrix<float>::SquareMatrix((SquareMatrix<float> *)(local_1e0 + 0x10),0x10);
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0,0);
  *pfVar2 = 0.31027228;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),1,0);
  *pfVar2 = 0.16950253;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),2,0);
  *pfVar2 = 0.19102572;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),3,0);
  *pfVar2 = 0.29750493;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),4,0);
  *pfVar2 = 0.025009377;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),5,0);
  *pfVar2 = 0.35266775;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),6,0);
  *pfVar2 = -0.14713013;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),7,0);
  *pfVar2 = 0.3214852;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),8,0);
  *pfVar2 = -0.28324705;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),9,0);
  *pfVar2 = 0.21159185;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),10,0);
  *pfVar2 = -0.3500152;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xb,0);
  *pfVar2 = 0.049893457;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xc,0);
  *pfVar2 = -0.33108744;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xd,0);
  *pfVar2 = -0.1240206;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xe,0);
  *pfVar2 = -0.23109792;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xf,0);
  *pfVar2 = -0.26757008;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0,1);
  *pfVar2 = -0.16950253;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),1,1);
  *pfVar2 = 0.31027228;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),2,1);
  *pfVar2 = -0.29750493;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),3,1);
  *pfVar2 = 0.19102572;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),4,1);
  *pfVar2 = -0.35266775;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),5,1);
  *pfVar2 = 0.025009377;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),6,1);
  *pfVar2 = -0.3214852;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),7,1);
  *pfVar2 = -0.14713013;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),8,1);
  *pfVar2 = -0.21159185;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),9,1);
  *pfVar2 = -0.28324705;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),10,1);
  *pfVar2 = -0.049893457;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xb,1);
  *pfVar2 = -0.3500152;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xc,1);
  *pfVar2 = 0.1240206;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xd,1);
  *pfVar2 = -0.33108744;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xe,1);
  *pfVar2 = 0.26757008;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xf,1);
  *pfVar2 = -0.23109792;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0,2);
  *pfVar2 = 0.31027228;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),1,2);
  *pfVar2 = 0.16950253;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),2,2);
  *pfVar2 = -0.19102572;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),3,2);
  *pfVar2 = -0.29750493;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),4,2);
  *pfVar2 = 0.025009377;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),5,2);
  *pfVar2 = 0.35266775;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),6,2);
  *pfVar2 = 0.14713013;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),7,2);
  *pfVar2 = -0.3214852;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),8,2);
  *pfVar2 = -0.28324705;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),9,2);
  *pfVar2 = 0.21159185;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),10,2);
  *pfVar2 = 0.3500152;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xb,2);
  *pfVar2 = -0.049893457;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xc,2);
  *pfVar2 = -0.33108744;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xd,2);
  *pfVar2 = -0.1240206;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xe,2);
  *pfVar2 = 0.23109792;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xf,2);
  *pfVar2 = 0.26757008;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0,3);
  *pfVar2 = -0.16950253;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),1,3);
  *pfVar2 = 0.31027228;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),2,3);
  *pfVar2 = 0.29750493;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),3,3);
  *pfVar2 = -0.19102572;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),4,3);
  *pfVar2 = -0.35266775;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),5,3);
  *pfVar2 = 0.025009377;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),6,3);
  *pfVar2 = 0.3214852;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),7,3);
  *pfVar2 = 0.14713013;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),8,3);
  *pfVar2 = -0.21159185;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),9,3);
  *pfVar2 = -0.28324705;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),10,3);
  *pfVar2 = 0.049893457;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xb,3);
  *pfVar2 = 0.3500152;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xc,3);
  *pfVar2 = 0.1240206;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xd,3);
  *pfVar2 = -0.33108744;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xe,3);
  *pfVar2 = -0.26757008;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xf,3);
  *pfVar2 = 0.23109792;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0,4);
  *pfVar2 = 0.31027228;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),1,4);
  *pfVar2 = 0.16950253;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),2,4);
  *pfVar2 = 0.19102572;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),3,4);
  *pfVar2 = 0.29750493;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),4,4);
  *pfVar2 = -0.025009377;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),5,4);
  *pfVar2 = -0.35266775;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),6,4);
  *pfVar2 = 0.14713013;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),7,4);
  *pfVar2 = -0.3214852;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),8,4);
  *pfVar2 = -0.28324705;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),9,4);
  *pfVar2 = 0.21159185;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),10,4);
  *pfVar2 = -0.3500152;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xb,4);
  *pfVar2 = 0.049893457;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xc,4);
  *pfVar2 = 0.33108744;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xd,4);
  *pfVar2 = 0.1240206;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xe,4);
  *pfVar2 = 0.23109792;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xf,4);
  *pfVar2 = 0.26757008;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0,5);
  *pfVar2 = -0.16950253;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),1,5);
  *pfVar2 = 0.31027228;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),2,5);
  *pfVar2 = -0.29750493;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),3,5);
  *pfVar2 = 0.19102572;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),4,5);
  *pfVar2 = 0.35266775;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),5,5);
  *pfVar2 = -0.025009377;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),6,5);
  *pfVar2 = 0.3214852;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),7,5);
  *pfVar2 = 0.14713013;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),8,5);
  *pfVar2 = -0.21159185;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),9,5);
  *pfVar2 = -0.28324705;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),10,5);
  *pfVar2 = -0.049893457;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xb,5);
  *pfVar2 = -0.3500152;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xc,5);
  *pfVar2 = -0.1240206;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xd,5);
  *pfVar2 = 0.33108744;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xe,5);
  *pfVar2 = -0.26757008;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xf,5);
  *pfVar2 = 0.23109792;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0,6);
  *pfVar2 = 0.31027228;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),1,6);
  *pfVar2 = 0.16950253;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),2,6);
  *pfVar2 = -0.19102572;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),3,6);
  *pfVar2 = -0.29750493;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),4,6);
  *pfVar2 = -0.025009377;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),5,6);
  *pfVar2 = -0.35266775;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),6,6);
  *pfVar2 = -0.14713013;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),7,6);
  *pfVar2 = 0.3214852;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),8,6);
  *pfVar2 = -0.28324705;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),9,6);
  *pfVar2 = 0.21159185;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),10,6);
  *pfVar2 = 0.3500152;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xb,6);
  *pfVar2 = -0.049893457;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xc,6);
  *pfVar2 = 0.33108744;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xd,6);
  *pfVar2 = 0.1240206;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xe,6);
  *pfVar2 = -0.23109792;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xf,6);
  *pfVar2 = -0.26757008;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0,7);
  *pfVar2 = -0.16950253;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),1,7);
  *pfVar2 = 0.31027228;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),2,7);
  *pfVar2 = 0.29750493;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),3,7);
  *pfVar2 = -0.19102572;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),4,7);
  *pfVar2 = 0.35266775;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),5,7);
  *pfVar2 = -0.025009377;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),6,7);
  *pfVar2 = -0.3214852;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),7,7);
  *pfVar2 = -0.14713013;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),8,7);
  *pfVar2 = -0.21159185;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),9,7);
  *pfVar2 = -0.28324705;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),10,7);
  *pfVar2 = 0.049893457;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xb,7);
  *pfVar2 = 0.3500152;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xc,7);
  *pfVar2 = -0.1240206;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xd,7);
  *pfVar2 = 0.33108744;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xe,7);
  *pfVar2 = 0.26757008;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xf,7);
  *pfVar2 = -0.23109792;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0,8);
  *pfVar2 = 0.31027228;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),1,8);
  *pfVar2 = 0.16950253;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),2,8);
  *pfVar2 = 0.19102572;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),3,8);
  *pfVar2 = 0.29750493;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),4,8);
  *pfVar2 = 0.025009377;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),5,8);
  *pfVar2 = 0.35266775;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),6,8);
  *pfVar2 = -0.14713013;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),7,8);
  *pfVar2 = 0.3214852;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),8,8);
  *pfVar2 = 0.28324705;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),9,8);
  *pfVar2 = -0.21159185;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),10,8);
  *pfVar2 = 0.3500152;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xb,8);
  *pfVar2 = -0.049893457;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xc,8);
  *pfVar2 = 0.33108744;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xd,8);
  *pfVar2 = 0.1240206;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xe,8);
  *pfVar2 = 0.23109792;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xf,8);
  *pfVar2 = 0.26757008;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0,9);
  *pfVar2 = -0.16950253;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),1,9);
  *pfVar2 = 0.31027228;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),2,9);
  *pfVar2 = -0.29750493;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),3,9);
  *pfVar2 = 0.19102572;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),4,9);
  *pfVar2 = -0.35266775;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),5,9);
  *pfVar2 = 0.025009377;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),6,9);
  *pfVar2 = -0.3214852;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),7,9);
  *pfVar2 = -0.14713013;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),8,9);
  *pfVar2 = 0.21159185;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),9,9);
  *pfVar2 = 0.28324705;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),10,9);
  *pfVar2 = 0.049893457;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xb,9);
  *pfVar2 = 0.3500152;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xc,9);
  *pfVar2 = -0.1240206;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xd,9);
  *pfVar2 = 0.33108744;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xe,9);
  *pfVar2 = -0.26757008;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xf,9);
  *pfVar2 = 0.23109792;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0,10);
  *pfVar2 = 0.31027228;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),1,10);
  *pfVar2 = 0.16950253;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),2,10);
  *pfVar2 = -0.19102572;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),3,10);
  *pfVar2 = -0.29750493;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),4,10);
  *pfVar2 = 0.025009377;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),5,10);
  *pfVar2 = 0.35266775;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),6,10);
  *pfVar2 = 0.14713013;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),7,10);
  *pfVar2 = -0.3214852;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),8,10);
  *pfVar2 = 0.28324705;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),9,10);
  *pfVar2 = -0.21159185;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),10,10);
  *pfVar2 = -0.3500152;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xb,10);
  *pfVar2 = 0.049893457;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xc,10);
  *pfVar2 = 0.33108744;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xd,10);
  *pfVar2 = 0.1240206;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xe,10);
  *pfVar2 = -0.23109792;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xf,10);
  *pfVar2 = -0.26757008;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0,0xb);
  *pfVar2 = -0.16950253;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),1,0xb);
  *pfVar2 = 0.31027228;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),2,0xb);
  *pfVar2 = 0.29750493;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),3,0xb);
  *pfVar2 = -0.19102572;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),4,0xb);
  *pfVar2 = -0.35266775;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),5,0xb);
  *pfVar2 = 0.025009377;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),6,0xb);
  *pfVar2 = 0.3214852;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),7,0xb);
  *pfVar2 = 0.14713013;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),8,0xb);
  *pfVar2 = 0.21159185;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),9,0xb);
  *pfVar2 = 0.28324705;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),10,0xb);
  *pfVar2 = -0.049893457;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xb,0xb);
  *pfVar2 = -0.3500152;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xc,0xb);
  *pfVar2 = -0.1240206;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xd,0xb);
  *pfVar2 = 0.33108744;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xe,0xb);
  *pfVar2 = 0.26757008;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xf,0xb);
  *pfVar2 = -0.23109792;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0,0xc);
  *pfVar2 = 0.31027228;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),1,0xc);
  *pfVar2 = 0.16950253;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),2,0xc);
  *pfVar2 = 0.19102572;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),3,0xc);
  *pfVar2 = 0.29750493;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),4,0xc);
  *pfVar2 = -0.025009377;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),5,0xc);
  *pfVar2 = -0.35266775;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),6,0xc);
  *pfVar2 = 0.14713013;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),7,0xc);
  *pfVar2 = -0.3214852;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),8,0xc);
  *pfVar2 = 0.28324705;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),9,0xc);
  *pfVar2 = -0.21159185;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),10,0xc);
  *pfVar2 = 0.3500152;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xb,0xc);
  *pfVar2 = -0.049893457;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xc,0xc);
  *pfVar2 = -0.33108744;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xd,0xc);
  *pfVar2 = -0.1240206;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xe,0xc);
  *pfVar2 = -0.23109792;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xf,0xc);
  *pfVar2 = -0.26757008;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0,0xd);
  *pfVar2 = -0.16950253;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),1,0xd);
  *pfVar2 = 0.31027228;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),2,0xd);
  *pfVar2 = -0.29750493;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),3,0xd);
  *pfVar2 = 0.19102572;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),4,0xd);
  *pfVar2 = 0.35266775;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),5,0xd);
  *pfVar2 = -0.025009377;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),6,0xd);
  *pfVar2 = 0.3214852;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),7,0xd);
  *pfVar2 = 0.14713013;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),8,0xd);
  *pfVar2 = 0.21159185;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),9,0xd);
  *pfVar2 = 0.28324705;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),10,0xd);
  *pfVar2 = 0.049893457;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xb,0xd);
  *pfVar2 = 0.3500152;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xc,0xd);
  *pfVar2 = 0.1240206;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xd,0xd);
  *pfVar2 = -0.33108744;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xe,0xd);
  *pfVar2 = 0.26757008;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xf,0xd);
  *pfVar2 = -0.23109792;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0,0xe);
  *pfVar2 = 0.31027228;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),1,0xe);
  *pfVar2 = 0.16950253;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),2,0xe);
  *pfVar2 = -0.19102572;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),3,0xe);
  *pfVar2 = -0.29750493;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),4,0xe);
  *pfVar2 = -0.025009377;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),5,0xe);
  *pfVar2 = -0.35266775;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),6,0xe);
  *pfVar2 = -0.14713013;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),7,0xe);
  *pfVar2 = 0.3214852;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),8,0xe);
  *pfVar2 = 0.28324705;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),9,0xe);
  *pfVar2 = -0.21159185;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),10,0xe);
  *pfVar2 = -0.3500152;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xb,0xe);
  *pfVar2 = 0.049893457;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xc,0xe);
  *pfVar2 = -0.33108744;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xd,0xe);
  *pfVar2 = -0.1240206;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xe,0xe);
  *pfVar2 = 0.23109792;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xf,0xe);
  *pfVar2 = 0.26757008;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0,0xf);
  *pfVar2 = -0.16950253;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),1,0xf);
  *pfVar2 = 0.31027228;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),2,0xf);
  *pfVar2 = 0.29750493;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),3,0xf);
  *pfVar2 = -0.19102572;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),4,0xf);
  *pfVar2 = 0.35266775;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),5,0xf);
  *pfVar2 = -0.025009377;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),6,0xf);
  *pfVar2 = -0.3214852;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),7,0xf);
  *pfVar2 = -0.14713013;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),8,0xf);
  *pfVar2 = 0.21159185;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),9,0xf);
  *pfVar2 = 0.28324705;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),10,0xf);
  *pfVar2 = -0.049893457;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xb,0xf);
  *pfVar2 = -0.3500152;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xc,0xf);
  *pfVar2 = 0.1240206;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xd,0xf);
  *pfVar2 = -0.33108744;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xe,0xf);
  *pfVar2 = -0.26757008;
  pfVar2 = qclab::dense::SquareMatrix<float>::operator()
                     ((SquareMatrix<float> *)(local_1e0 + 0x10),0xf,0xf);
  *pfVar2 = 0.23109792;
  qclab::QCircuit<float,_qclab::QObject<float>_>::matrix
            ((QCircuit<float,_qclab::QObject<float>_> *)local_1e0);
  test_qpixl_frqi_check_matrix<qclab::dense::SquareMatrix<float>,qclab::dense::SquareMatrix<float>,float>
            ((SquareMatrix<float> *)local_1e0,(SquareMatrix<float> *)(local_1e0 + 0x10),
             1.1920929e-06);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)local_1e0);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)(local_1e0 + 0x10));
  qclab::QCircuit<float,_qclab::QObject<float>_>::~QCircuit
            ((QCircuit<float,_qclab::QObject<float>_> *)&circC_check.data_);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_150);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)local_128);
  qclab::QCircuit<float,_qclab::QObject<float>_>::~QCircuit
            ((QCircuit<float,_qclab::QObject<float>_> *)&circB_check.data_);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_c0);
  qclab::dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)local_98);
  qclab::QCircuit<float,_qclab::QObject<float>_>::~QCircuit
            ((QCircuit<float,_qclab::QObject<float>_> *)&circA_check.data_);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_28);
  return;
}

Assistant:

void test_qpixl_frqi_compressedFRQICircuit() {
  const R eps = std::numeric_limits< R >::epsilon() ;

  std::vector< R > a = { 0.5 , 1 } ;

  auto circA = qpixl::frqi::compressedFRQICircuit( a ) ;

  // matrix
  qclab::dense::SquareMatrix< R > circA_check(    
  0.620544580563746, -0.339005049421045,  0.620544580563746, -0.339005049421045,
  0.339005049421045,  0.620544580563746,  0.339005049421045,  0.620544580563746,
  0.382051424370090, -0.595009839529386, -0.382051424370090,  0.595009839529386,
  0.595009839529386,  0.382051424370090, -0.595009839529386, -0.382051424370090
  ) ;

  test_qpixl_frqi_check_matrix( circA.matrix() , circA_check  , 10*eps );
  
  
  std::vector< R > b = { 0.5 , 1 , 1.5 , 2 };

  auto circB = qpixl::frqi::compressedFRQICircuit( b ) ;

  // matrix
  qclab::dense::SquareMatrix< R > circB_check( 8 ) ;

  circB_check( 0, 0 ) =  0.438791280945186 ;
  circB_check( 1, 0 ) =  0.239712769302101 ;
  circB_check( 2, 0 ) =  0.270151152934070 ;
  circB_check( 3, 0 ) =  0.420735492403948 ;
  circB_check( 4, 0 ) =  0.035368600833851 ;
  circB_check( 5, 0 ) =  0.498747493302027 ;
  circB_check( 6, 0 ) = -0.208073418273571 ;
  circB_check( 7, 0 ) =  0.454648713412841 ;

  circB_check( 0, 1 ) = -0.239712769302101 ;
  circB_check( 1, 1 ) =  0.438791280945186 ;
  circB_check( 2, 1 ) = -0.420735492403948 ;
  circB_check( 3, 1 ) =  0.270151152934070 ;
  circB_check( 4, 1 ) = -0.498747493302027 ;
  circB_check( 5, 1 ) =  0.035368600833851 ;
  circB_check( 6, 1 ) = -0.454648713412841 ;
  circB_check( 7, 1 ) = -0.208073418273571 ;

  circB_check( 0, 2 ) =  0.438791280945186 ;
  circB_check( 1, 2 ) =  0.239712769302101 ;
  circB_check( 2, 2 ) = -0.270151152934070 ;
  circB_check( 3, 2 ) = -0.420735492403948 ;
  circB_check( 4, 2 ) =  0.035368600833851 ;
  circB_check( 5, 2 ) =  0.498747493302027 ;
  circB_check( 6, 2 ) =  0.208073418273571 ;
  circB_check( 7, 2 ) = -0.454648713412841 ;

  circB_check( 0, 3 ) = -0.239712769302101 ;
  circB_check( 1, 3 ) =  0.438791280945186 ;
  circB_check( 2, 3 ) =  0.420735492403948 ;
  circB_check( 3, 3 ) = -0.270151152934070 ;
  circB_check( 4, 3 ) = -0.498747493302027 ;
  circB_check( 5, 3 ) =  0.035368600833851 ;
  circB_check( 6, 3 ) =  0.454648713412841 ;
  circB_check( 7, 3 ) =  0.208073418273571 ;

  circB_check( 0, 4 ) =  0.438791280945186 ;
  circB_check( 1, 4 ) =  0.239712769302101 ;
  circB_check( 2, 4 ) =  0.270151152934070 ;
  circB_check( 3, 4 ) =  0.420735492403948 ;
  circB_check( 4, 4 ) = -0.035368600833851 ;
  circB_check( 5, 4 ) = -0.498747493302027 ;
  circB_check( 6, 4 ) =  0.208073418273571 ;
  circB_check( 7, 4 ) = -0.454648713412841 ;

  circB_check( 0, 5 ) = -0.239712769302101 ;
  circB_check( 1, 5 ) =  0.438791280945186 ;
  circB_check( 2, 5 ) = -0.420735492403948 ;
  circB_check( 3, 5 ) =  0.270151152934070 ;
  circB_check( 4, 5 ) =  0.498747493302027 ;
  circB_check( 5, 5 ) = -0.035368600833851 ;
  circB_check( 6, 5 ) =  0.454648713412841 ;
  circB_check( 7, 5 ) =  0.208073418273571 ;

  circB_check( 0, 6 ) =  0.438791280945186 ;
  circB_check( 1, 6 ) =  0.239712769302101 ;
  circB_check( 2, 6 ) = -0.270151152934070 ;
  circB_check( 3, 6 ) = -0.420735492403948 ;
  circB_check( 4, 6 ) = -0.035368600833851 ;
  circB_check( 5, 6 ) = -0.498747493302027 ;
  circB_check( 6, 6 ) = -0.208073418273571 ;
  circB_check( 7, 6 ) =  0.454648713412841 ;

  circB_check( 0, 7 ) = -0.239712769302101 ;
  circB_check( 1, 7 ) =  0.438791280945186 ;
  circB_check( 2, 7 ) =  0.420735492403948 ;
  circB_check( 3, 7 ) = -0.270151152934070 ;
  circB_check( 4, 7 ) =  0.498747493302027 ;
  circB_check( 5, 7 ) = -0.035368600833851 ;
  circB_check( 6, 7 ) = -0.454648713412841 ;
  circB_check( 7, 7 ) = -0.208073418273571 ;


  test_qpixl_frqi_check_matrix( circB.matrix() , circB_check  , 10*eps );



  std::vector< R > c = { 0.5 , 1 , 1.5 , 2 , 2.5 , 3 , 3.5 , 4 };

  auto circC = qpixl::frqi::compressedFRQICircuit( c ) ;  

  // matrix
  qclab::dense::SquareMatrix< R > circC_check( 16 ) ;

  circC_check(  0, 0 ) =    0.310272290281873 ;
  circC_check(  1, 0 ) =    0.169502524710522 ;
  circC_check(  2, 0 ) =    0.191025712185045 ;
  circC_check(  3, 0 ) =    0.297504919764693 ;
  circC_check(  4, 0 ) =    0.025009377490697 ;
  circC_check(  5, 0 ) =    0.352667734613656 ;
  circC_check(  6, 0 ) =   -0.147130125045907 ;
  circC_check(  7, 0 ) =    0.321485188311959 ;
  circC_check(  8, 0 ) =   -0.283247041628773 ;
  circC_check(  9, 0 ) =    0.211591855723580 ;
  circC_check( 10, 0 ) =   -0.350015203834987 ;
  circC_check( 11, 0 ) =    0.049893457330116 ;
  circC_check( 12, 0 ) =   -0.331087436935406 ;
  circC_check( 13, 0 ) =   -0.124020599512917 ;
  circC_check( 14, 0 ) =   -0.231097918395994 ;
  circC_check( 15, 0 ) =   -0.267570088225568 ;

  circC_check(  0, 1 ) =   -0.169502524710522 ;
  circC_check(  1, 1 ) =    0.310272290281873 ;
  circC_check(  2, 1 ) =   -0.297504919764693 ;
  circC_check(  3, 1 ) =    0.191025712185045 ;
  circC_check(  4, 1 ) =   -0.352667734613656 ;
  circC_check(  5, 1 ) =    0.025009377490697 ;
  circC_check(  6, 1 ) =   -0.321485188311959 ;
  circC_check(  7, 1 ) =   -0.147130125045907 ;
  circC_check(  8, 1 ) =   -0.211591855723580 ;
  circC_check(  9, 1 ) =   -0.283247041628773 ;
  circC_check( 10, 1 ) =   -0.049893457330116 ;
  circC_check( 11, 1 ) =   -0.350015203834987 ;
  circC_check( 12, 1 ) =    0.124020599512917 ;
  circC_check( 13, 1 ) =   -0.331087436935406 ;
  circC_check( 14, 1 ) =    0.267570088225568 ;
  circC_check( 15, 1 ) =   -0.231097918395994 ;

  circC_check(  0, 2 ) =    0.310272290281873 ;
  circC_check(  1, 2 ) =    0.169502524710522 ;
  circC_check(  2, 2 ) =   -0.191025712185045 ;
  circC_check(  3, 2 ) =   -0.297504919764693 ;
  circC_check(  4, 2 ) =    0.025009377490697 ;
  circC_check(  5, 2 ) =    0.352667734613656 ;
  circC_check(  6, 2 ) =    0.147130125045907 ;
  circC_check(  7, 2 ) =   -0.321485188311959 ;
  circC_check(  8, 2 ) =   -0.283247041628773 ;
  circC_check(  9, 2 ) =    0.211591855723580 ;
  circC_check( 10, 2 ) =    0.350015203834987 ;
  circC_check( 11, 2 ) =   -0.049893457330116 ;
  circC_check( 12, 2 ) =   -0.331087436935406 ;
  circC_check( 13, 2 ) =   -0.124020599512917 ;
  circC_check( 14, 2 ) =    0.231097918395994 ;
  circC_check( 15, 2 ) =    0.267570088225568 ;

  circC_check(  0, 3 ) =   -0.169502524710522 ;
  circC_check(  1, 3 ) =    0.310272290281873 ;
  circC_check(  2, 3 ) =    0.297504919764693 ;
  circC_check(  3, 3 ) =   -0.191025712185045 ;
  circC_check(  4, 3 ) =   -0.352667734613656 ;
  circC_check(  5, 3 ) =    0.025009377490697 ;
  circC_check(  6, 3 ) =    0.321485188311959 ;
  circC_check(  7, 3 ) =    0.147130125045907 ;
  circC_check(  8, 3 ) =   -0.211591855723580 ;
  circC_check(  9, 3 ) =   -0.283247041628773 ;
  circC_check( 10, 3 ) =    0.049893457330116 ;
  circC_check( 11, 3 ) =    0.350015203834987 ;
  circC_check( 12, 3 ) =    0.124020599512917 ;
  circC_check( 13, 3 ) =   -0.331087436935406 ;
  circC_check( 14, 3 ) =   -0.267570088225568 ;
  circC_check( 15, 3 ) =    0.231097918395994 ;

  circC_check(  0, 4 ) =    0.310272290281873 ;
  circC_check(  1, 4 ) =    0.169502524710522 ;
  circC_check(  2, 4 ) =    0.191025712185045 ;
  circC_check(  3, 4 ) =    0.297504919764693 ;
  circC_check(  4, 4 ) =   -0.025009377490697 ;
  circC_check(  5, 4 ) =   -0.352667734613656 ;
  circC_check(  6, 4 ) =    0.147130125045907 ;
  circC_check(  7, 4 ) =   -0.321485188311959 ;
  circC_check(  8, 4 ) =   -0.283247041628773 ;
  circC_check(  9, 4 ) =    0.211591855723580 ;
  circC_check( 10, 4 ) =   -0.350015203834987 ;
  circC_check( 11, 4 ) =    0.049893457330116 ;
  circC_check( 12, 4 ) =    0.331087436935406 ;
  circC_check( 13, 4 ) =    0.124020599512917 ;
  circC_check( 14, 4 ) =    0.231097918395994 ;
  circC_check( 15, 4 ) =    0.267570088225568 ;

  circC_check(  0, 5 ) =   -0.169502524710522 ;
  circC_check(  1, 5 ) =    0.310272290281873 ;
  circC_check(  2, 5 ) =   -0.297504919764693 ;
  circC_check(  3, 5 ) =    0.191025712185045 ;
  circC_check(  4, 5 ) =    0.352667734613656 ;
  circC_check(  5, 5 ) =   -0.025009377490697 ;
  circC_check(  6, 5 ) =    0.321485188311959 ;
  circC_check(  7, 5 ) =    0.147130125045907 ;
  circC_check(  8, 5 ) =   -0.211591855723580 ;
  circC_check(  9, 5 ) =   -0.283247041628773 ;
  circC_check( 10, 5 ) =   -0.049893457330116 ;
  circC_check( 11, 5 ) =   -0.350015203834987 ;
  circC_check( 12, 5 ) =   -0.124020599512917 ;
  circC_check( 13, 5 ) =    0.331087436935406 ;
  circC_check( 14, 5 ) =   -0.267570088225568 ;
  circC_check( 15, 5 ) =    0.231097918395994 ;

  circC_check(  0, 6 ) =    0.310272290281873 ;
  circC_check(  1, 6 ) =    0.169502524710522 ;
  circC_check(  2, 6 ) =   -0.191025712185045 ;
  circC_check(  3, 6 ) =   -0.297504919764693 ;
  circC_check(  4, 6 ) =   -0.025009377490697 ;
  circC_check(  5, 6 ) =   -0.352667734613656 ;
  circC_check(  6, 6 ) =   -0.147130125045907 ;
  circC_check(  7, 6 ) =    0.321485188311959 ;
  circC_check(  8, 6 ) =   -0.283247041628773 ;
  circC_check(  9, 6 ) =    0.211591855723580 ;
  circC_check( 10, 6 ) =    0.350015203834987 ;
  circC_check( 11, 6 ) =   -0.049893457330116 ;
  circC_check( 12, 6 ) =    0.331087436935406 ;
  circC_check( 13, 6 ) =    0.124020599512917 ;
  circC_check( 14, 6 ) =   -0.231097918395994 ;
  circC_check( 15, 6 ) =   -0.267570088225568 ;

  circC_check(  0, 7 ) =   -0.169502524710522 ;
  circC_check(  1, 7 ) =    0.310272290281873 ;
  circC_check(  2, 7 ) =    0.297504919764693 ;
  circC_check(  3, 7 ) =   -0.191025712185045 ;
  circC_check(  4, 7 ) =    0.352667734613656 ;
  circC_check(  5, 7 ) =   -0.025009377490697 ;
  circC_check(  6, 7 ) =   -0.321485188311959 ;
  circC_check(  7, 7 ) =   -0.147130125045907 ;
  circC_check(  8, 7 ) =   -0.211591855723580 ;
  circC_check(  9, 7 ) =   -0.283247041628773 ;
  circC_check( 10, 7 ) =    0.049893457330116 ;
  circC_check( 11, 7 ) =    0.350015203834987 ;
  circC_check( 12, 7 ) =   -0.124020599512917 ;
  circC_check( 13, 7 ) =    0.331087436935406 ;
  circC_check( 14, 7 ) =    0.267570088225568 ;
  circC_check( 15, 7 ) =   -0.231097918395994 ;

  circC_check(  0, 8 ) =    0.310272290281873 ;
  circC_check(  1, 8 ) =    0.169502524710522 ;
  circC_check(  2, 8 ) =    0.191025712185045 ;
  circC_check(  3, 8 ) =    0.297504919764693 ;
  circC_check(  4, 8 ) =    0.025009377490697 ;
  circC_check(  5, 8 ) =    0.352667734613656 ;
  circC_check(  6, 8 ) =   -0.147130125045907 ;
  circC_check(  7, 8 ) =    0.321485188311959 ;
  circC_check(  8, 8 ) =    0.283247041628773 ;
  circC_check(  9, 8 ) =   -0.211591855723580 ;
  circC_check( 10, 8 ) =    0.350015203834987 ;
  circC_check( 11, 8 ) =   -0.049893457330116 ;
  circC_check( 12, 8 ) =    0.331087436935406 ;
  circC_check( 13, 8 ) =    0.124020599512917 ;
  circC_check( 14, 8 ) =    0.231097918395994 ;
  circC_check( 15, 8 ) =    0.267570088225568 ;

  circC_check(  0, 9 ) =   -0.169502524710522 ;
  circC_check(  1, 9 ) =    0.310272290281873 ;
  circC_check(  2, 9 ) =   -0.297504919764693 ;
  circC_check(  3, 9 ) =    0.191025712185045 ;
  circC_check(  4, 9 ) =   -0.352667734613656 ;
  circC_check(  5, 9 ) =    0.025009377490697 ;
  circC_check(  6, 9 ) =   -0.321485188311959 ;
  circC_check(  7, 9 ) =   -0.147130125045907 ;
  circC_check(  8, 9 ) =    0.211591855723580 ;
  circC_check(  9, 9 ) =    0.283247041628773 ;
  circC_check( 10, 9 ) =    0.049893457330116 ;
  circC_check( 11, 9 ) =    0.350015203834987 ;
  circC_check( 12, 9 ) =   -0.124020599512917 ;
  circC_check( 13, 9 ) =    0.331087436935406 ;
  circC_check( 14, 9 ) =   -0.267570088225568 ;
  circC_check( 15, 9 ) =    0.231097918395994 ;

  circC_check(  0, 10 ) =    0.310272290281873 ;
  circC_check(  1, 10 ) =    0.169502524710522 ;
  circC_check(  2, 10 ) =   -0.191025712185045 ;
  circC_check(  3, 10 ) =   -0.297504919764693 ;
  circC_check(  4, 10 ) =    0.025009377490697 ;
  circC_check(  5, 10 ) =    0.352667734613656 ;
  circC_check(  6, 10 ) =    0.147130125045907 ;
  circC_check(  7, 10 ) =   -0.321485188311959 ;
  circC_check(  8, 10 ) =    0.283247041628773 ;
  circC_check(  9, 10 ) =   -0.211591855723580 ;
  circC_check( 10, 10 ) =   -0.350015203834987 ;
  circC_check( 11, 10 ) =    0.049893457330116 ;
  circC_check( 12, 10 ) =    0.331087436935406 ;
  circC_check( 13, 10 ) =    0.124020599512917 ;
  circC_check( 14, 10 ) =   -0.231097918395994 ;
  circC_check( 15, 10 ) =   -0.267570088225568 ;

  circC_check(  0, 11 ) =   -0.169502524710522 ;
  circC_check(  1, 11 ) =    0.310272290281873 ;
  circC_check(  2, 11 ) =    0.297504919764693 ;
  circC_check(  3, 11 ) =   -0.191025712185045 ;
  circC_check(  4, 11 ) =   -0.352667734613656 ;
  circC_check(  5, 11 ) =    0.025009377490697 ;
  circC_check(  6, 11 ) =    0.321485188311959 ;
  circC_check(  7, 11 ) =    0.147130125045907 ;
  circC_check(  8, 11 ) =    0.211591855723580 ;
  circC_check(  9, 11 ) =    0.283247041628773 ;
  circC_check( 10, 11 ) =   -0.049893457330116 ;
  circC_check( 11, 11 ) =   -0.350015203834987 ;
  circC_check( 12, 11 ) =   -0.124020599512917 ;
  circC_check( 13, 11 ) =    0.331087436935406 ;
  circC_check( 14, 11 ) =    0.267570088225568 ;
  circC_check( 15, 11 ) =   -0.231097918395994 ;

  circC_check(  0, 12 ) =    0.310272290281873 ;
  circC_check(  1, 12 ) =    0.169502524710522 ;
  circC_check(  2, 12 ) =    0.191025712185045 ;
  circC_check(  3, 12 ) =    0.297504919764693 ;
  circC_check(  4, 12 ) =   -0.025009377490697 ;
  circC_check(  5, 12 ) =   -0.352667734613656 ;
  circC_check(  6, 12 ) =    0.147130125045907 ;
  circC_check(  7, 12 ) =   -0.321485188311959 ;
  circC_check(  8, 12 ) =    0.283247041628773 ;
  circC_check(  9, 12 ) =   -0.211591855723580 ;
  circC_check( 10, 12 ) =    0.350015203834987 ;
  circC_check( 11, 12 ) =   -0.049893457330116 ;
  circC_check( 12, 12 ) =   -0.331087436935406 ;
  circC_check( 13, 12 ) =   -0.124020599512917 ;
  circC_check( 14, 12 ) =   -0.231097918395994 ;
  circC_check( 15, 12 ) =   -0.267570088225568 ;

  circC_check(  0, 13 ) =   -0.169502524710522 ;
  circC_check(  1, 13 ) =    0.310272290281873 ;
  circC_check(  2, 13 ) =   -0.297504919764693 ;
  circC_check(  3, 13 ) =    0.191025712185045 ;
  circC_check(  4, 13 ) =    0.352667734613656 ;
  circC_check(  5, 13 ) =   -0.025009377490697 ;
  circC_check(  6, 13 ) =    0.321485188311959 ;
  circC_check(  7, 13 ) =    0.147130125045907 ;
  circC_check(  8, 13 ) =    0.211591855723580 ;
  circC_check(  9, 13 ) =    0.283247041628773 ;
  circC_check( 10, 13 ) =    0.049893457330116 ;
  circC_check( 11, 13 ) =    0.350015203834987 ;
  circC_check( 12, 13 ) =    0.124020599512917 ;
  circC_check( 13, 13 ) =   -0.331087436935406 ;
  circC_check( 14, 13 ) =    0.267570088225568 ;
  circC_check( 15, 13 ) =   -0.231097918395994 ;

  circC_check(  0, 14 ) =    0.310272290281873 ;
  circC_check(  1, 14 ) =    0.169502524710522 ;
  circC_check(  2, 14 ) =   -0.191025712185045 ;
  circC_check(  3, 14 ) =   -0.297504919764693 ;
  circC_check(  4, 14 ) =   -0.025009377490697 ;
  circC_check(  5, 14 ) =   -0.352667734613656 ;
  circC_check(  6, 14 ) =   -0.147130125045907 ;
  circC_check(  7, 14 ) =    0.321485188311959 ;
  circC_check(  8, 14 ) =    0.283247041628773 ;
  circC_check(  9, 14 ) =   -0.211591855723580 ;
  circC_check( 10, 14 ) =   -0.350015203834987 ;
  circC_check( 11, 14 ) =    0.049893457330116 ;
  circC_check( 12, 14 ) =   -0.331087436935406 ;
  circC_check( 13, 14 ) =   -0.124020599512917 ;
  circC_check( 14, 14 ) =    0.231097918395994 ;
  circC_check( 15, 14 ) =    0.267570088225568 ;

  circC_check(  0, 15 ) =   -0.169502524710522 ;
  circC_check(  1, 15 ) =    0.310272290281873 ;
  circC_check(  2, 15 ) =    0.297504919764693 ;
  circC_check(  3, 15 ) =   -0.191025712185045 ;
  circC_check(  4, 15 ) =    0.352667734613656 ;
  circC_check(  5, 15 ) =   -0.025009377490697 ;
  circC_check(  6, 15 ) =   -0.321485188311959 ;
  circC_check(  7, 15 ) =   -0.147130125045907 ;
  circC_check(  8, 15 ) =    0.211591855723580 ;
  circC_check(  9, 15 ) =    0.283247041628773 ;
  circC_check( 10, 15 ) =   -0.049893457330116 ;
  circC_check( 11, 15 ) =   -0.350015203834987 ;
  circC_check( 12, 15 ) =    0.124020599512917 ;
  circC_check( 13, 15 ) =   -0.331087436935406 ;
  circC_check( 14, 15 ) =   -0.267570088225568 ;
  circC_check( 15, 15 ) =    0.231097918395994 ;

  test_qpixl_frqi_check_matrix( circC.matrix() , circC_check  , 10*eps );
}